

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

iterator __thiscall
QVLABase<QDialogButtonBox::StandardButton>::erase
          (QVLABase<QDialogButtonBox::StandardButton> *this,const_iterator abegin,
          const_iterator aend)

{
  const_iterator pSVar1;
  long lVar2;
  long lVar3;
  StandardButton *pSVar4;
  StandardButton *pSVar5;
  size_type sVar6;
  long in_RDX;
  long in_RSI;
  QVLABaseBase *in_RDI;
  qsizetype n;
  qsizetype l;
  qsizetype f;
  StandardButton *in_stack_ffffffffffffff98;
  StandardButton *in_stack_ffffffffffffffa0;
  StandardButton *local_8;
  
  pSVar1 = cbegin((QVLABase<QDialogButtonBox::StandardButton> *)0x6761f0);
  lVar2 = in_RSI - (long)pSVar1 >> 2;
  pSVar1 = cbegin((QVLABase<QDialogButtonBox::StandardButton> *)0x676218);
  lVar3 = in_RDX - (long)pSVar1 >> 2;
  if (lVar3 - lVar2 == 0) {
    local_8 = data((QVLABase<QDialogButtonBox::StandardButton> *)in_RDI);
  }
  else {
    std::destroy<QDialogButtonBox::StandardButton_const*>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    pSVar4 = data((QVLABase<QDialogButtonBox::StandardButton> *)in_RDI);
    pSVar4 = pSVar4 + lVar2;
    pSVar5 = data((QVLABase<QDialogButtonBox::StandardButton> *)in_RDI);
    sVar6 = QVLABaseBase::size(in_RDI);
    memmove(pSVar4,pSVar5 + lVar3,(sVar6 - lVar3) * 4);
    in_RDI->s = in_RDI->s - (lVar3 - lVar2);
    local_8 = data((QVLABase<QDialogButtonBox::StandardButton> *)in_RDI);
  }
  local_8 = local_8 + lVar2;
  return local_8;
}

Assistant:

Q_OUTOFLINE_TEMPLATE auto QVLABase<T>::erase(const_iterator abegin, const_iterator aend) -> iterator
{
    Q_ASSERT_X(isValidIterator(abegin), "QVarLengthArray::erase", "The specified const_iterator argument 'abegin' is invalid");
    Q_ASSERT_X(isValidIterator(aend), "QVarLengthArray::erase", "The specified const_iterator argument 'aend' is invalid");

    qsizetype f = qsizetype(abegin - cbegin());
    qsizetype l = qsizetype(aend - cbegin());
    qsizetype n = l - f;

    if (n == 0) // avoid UB in std::move() below
        return data() + f;

    Q_ASSERT(n > 0); // aend must be reachable from abegin

    if constexpr (!QTypeInfo<T>::isRelocatable) {
        std::move(begin() + l, end(), QT_MAKE_CHECKED_ARRAY_ITERATOR(begin() + f, size() - f));
        std::destroy(end() - n, end());
    } else {
        std::destroy(abegin, aend);
        memmove(static_cast<void *>(data() + f), static_cast<const void *>(data() + l), (size() - l) * sizeof(T));
    }
    this->s -= n;
    return data() + f;
}